

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memleak.cc
# Opt level: O1

void * memleak_alloc(size_t size,char *file,size_t line)

{
  void *__s;
  undefined8 *puVar1;
  
  __s = malloc(size);
  if ((__s != (void *)0x0) && ((start_sw & 1) != 0)) {
    pthread_spin_lock(&lock);
    puVar1 = (undefined8 *)malloc(0x38);
    *puVar1 = __s;
    puVar1[1] = file;
    puVar1[3] = line;
    puVar1[2] = size;
    memset(__s,0x77,size);
    avl_insert(&tree_index,(avl_node *)(puVar1 + 4),memleak_cmp);
    pthread_spin_unlock(&lock);
  }
  return __s;
}

Assistant:

LIBMEMLEAK_API
void * memleak_alloc(size_t size, char *file, size_t line)
{
    void *addr = (void*)malloc(size);
    if (addr && start_sw) {
        spin_lock(&lock);
        _memleak_add_to_index(addr, size, file, line, INIT_VAL);
        spin_unlock(&lock);
    }

    return addr;
}